

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O0

void ggml_compute_forward_diag_mask_inf(ggml_compute_params *params,ggml_tensor *dst)

{
  long in_RSI;
  ggml_tensor *src0;
  float in_stack_00000034;
  ggml_tensor *in_stack_00000038;
  ggml_compute_params *in_stack_00000040;
  
  if (**(int **)(in_RSI + 0x98) == 0) {
    ggml_compute_forward_diag_mask_f32(in_stack_00000040,in_stack_00000038,in_stack_00000034);
  }
  else {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x1208,"fatal error");
  }
  return;
}

Assistant:

void ggml_compute_forward_diag_mask_inf(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_diag_mask_f32(params, dst, -INFINITY);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}